

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parser.cpp
# Opt level: O2

void franca::error_handler(char *begin,char *end,char *where,info *what)

{
  reverse_iterator<const_char_*> rVar1;
  char *pcVar2;
  ostream *poVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  reverse_iterator<const_char_*> local_80 [2];
  char local_70 [16];
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  char *local_40;
  reverse_iterator<const_char_*> local_38;
  
  local_60[0] = (undefined1 *)CONCAT71(local_60[0]._1_7_,10);
  local_40 = begin;
  local_38.current = where;
  std::find<std::reverse_iterator<char_const*>,char>(local_80,&local_38,(char *)&local_40);
  rVar1.current = local_80[0].current;
  local_80[0].current._0_1_ = (string)0xa;
  pcVar2 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                     (where,end,local_80);
  local_80[0].current._0_1_ = (string)0xa;
  std::__count_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
            (begin,where,(_Iter_equals_val<const_char>)local_80);
  poVar3 = std::operator<<((ostream *)&std::cout,"Expecting ");
  pbVar4 = boost::spirit::operator<<(poVar3,what);
  poVar3 = std::operator<<(pbVar4," in line ");
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  local_80[0].current = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,rVar1.current,where);
  poVar3 = std::operator<<(poVar3,(string *)local_80);
  poVar3 = std::operator<<(poVar3,"\x1b[1;31m");
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,where,pcVar2);
  poVar3 = std::operator<<(poVar3,(string *)local_60);
  poVar3 = std::operator<<(poVar3,"\x1b[0m");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)local_80);
  return;
}

Assistant:

void error_handler(const char* begin, const char* end, const char* where,
		boost::spirit::qi::info const& what)
{
	std::reverse_iterator<const char*> rev_end(begin);
	std::reverse_iterator<const char*> rev_where(where);

	auto const line_begin = std::find(rev_where, rev_end, '\n').base();
	auto const line_end = std::find(where, end, '\n');

	auto const line_nr = 1 + std::count(begin, where, '\n');

	std::cout
		<< "Expecting " << what << " in line " << line_nr << std::endl
		<< std::string(line_begin, where)
		<< "\033[1;31m"
		<< std::string(where, line_end)
		<< "\033[0m"
		<< std::endl
		;
}